

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void chrono::Transform_Cq_to_Cqw_row
               (ChMatrixNM<double,_7,_BODY_QDOF> *mCq,int qrow,ChMatrixRef *mCqw,int qwrow,
               ChGlMatrix34<double> *Gl)

{
  double dVar1;
  undefined1 auVar2 [16];
  CoeffReturnType pdVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  long lVar6;
  int colres;
  long row;
  int col;
  long col_00;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Block<const_Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_3,_false> local_90;
  Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,_3,_false>
  local_60;
  
  Eigen::Block<const_Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_3,_false>::Block
            (&local_90,mCq,(long)qrow,0);
  Eigen::
  Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_3,_false>
  ::Block(&local_60,mCqw,(long)qwrow,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,1,3,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>const,1,3,false>>
            (&local_60,&local_90);
  for (row = 0; row != 3; row = row + 1) {
    auVar8 = ZEXT816(0) << 0x40;
    lVar6 = 4;
    col_00 = 0;
    while( true ) {
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar7) break;
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_0> *)mCq,(long)qrow
                          ,col_00 + 3);
      dVar1 = *pdVar3;
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0> *)Gl,row,col_00)
      ;
      auVar8._8_8_ = 0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar1;
      col_00 = col_00 + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *pdVar4;
      auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar2);
    }
    pSVar5 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           *)mCqw,(long)qwrow,row + 3);
    *pSVar5 = auVar8._0_8_ * 0.25;
  }
  return;
}

Assistant:

void Transform_Cq_to_Cqw_row(const ChMatrixNM<double, 7, BODY_QDOF>& mCq, int qrow, ChMatrixRef mCqw, int qwrow, const ChGlMatrix34<>& Gl) {
    // translational part - not changed
    mCqw.block<1, 3>(qwrow, 0) = mCq.block<1, 3>(qrow, 0);

    // rotational part [Cq_w] = [Cq_q]*[Gl]'*1/4
    for (int colres = 0; colres < 3; colres++) {
        double sum = 0;
        for (int col = 0; col < 4; col++) {
            sum += mCq(qrow, col + 3) * Gl(colres, col);
        }
        mCqw(qwrow, colres + 3) = sum * 0.25;
    }
    //// RADU: explicit loop slightly more performant than Eigen expressions
    ////mCqw.block<1, 3>(qwrow, 3) = 0.25 * mCq.block<1, 4>(qrow, 3) * Gl.transpose();
}